

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

void bn_correct_top(BIGNUM *a)

{
  int iVar1;
  long lVar2;
  
  iVar1 = a->top;
  lVar2 = (long)iVar1;
  if (0 < lVar2) {
    for (; 0 < (int)lVar2; lVar2 = lVar2 + -1) {
      if (a->d[lVar2 + -1] != 0) goto LAB_00111c96;
    }
    lVar2 = 0;
LAB_00111c96:
    iVar1 = (int)lVar2;
    a->top = iVar1;
  }
  if (iVar1 != 0) {
    return;
  }
  a->neg = 0;
  return;
}

Assistant:

void bn_correct_top(BIGNUM *a)
{
    BN_ULONG *ftl;
    int tmp_top = a->top;

    if (tmp_top > 0) {
        for (ftl = &(a->d[tmp_top]); tmp_top > 0; tmp_top--) {
            ftl--;
            if (*ftl != 0)
                break;
        }
        a->top = tmp_top;
    }
    if (a->top == 0)
        a->neg = 0;
    bn_pollute(a);
}